

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

void print_comm_stat_table(dlog_mt_comm_stat_params_t *comm_stat_table)

{
  uint local_14;
  int i;
  dlog_mt_comm_stat_params_t *comm_stat_table_local;
  
  printf("\tStart time:     %02d:%02d\n",(ulong)comm_stat_table->perfstats_start_time[0],
         (ulong)comm_stat_table->perfstats_start_time[1]);
  printf("\tDuration:       %02dd\n",(ulong)comm_stat_table->perfstats_duration);
  printf("\tThreshold:      %02d\n",(ulong)comm_stat_table->perfstats_threshold);
  for (local_14 = 0; (int)local_14 < 4; local_14 = local_14 + 1) {
    printf("\tTimestamp[%d]:   %02d:%02d\n",(ulong)local_14,
           (ulong)comm_stat_table->perfstats_timestamp[(int)local_14][0],
           (ulong)comm_stat_table->perfstats_timestamp[(int)local_14][1]);
  }
  return;
}

Assistant:

extern void print_comm_stat_table(dlog_mt_comm_stat_params_t* comm_stat_table) {
    int i;

    printf("\tStart time:     %02d:%02d\n",
        comm_stat_table->perfstats_start_time[0], comm_stat_table->perfstats_start_time[1]);
    printf("\tDuration:       %02dd\n", comm_stat_table->perfstats_duration);
    printf("\tThreshold:      %02d\n", comm_stat_table->perfstats_threshold);

    for (i = 0; i < 4; i++) {
        printf("\tTimestamp[%d]:   %02d:%02d\n", i,
            comm_stat_table->perfstats_timestamp[i][0], comm_stat_table->perfstats_timestamp[i][1]);
    }
}